

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pocketsphinx.c
# Opt level: O0

long ps_decode_raw(ps_decoder_t *ps,FILE *rawfh,long maxsamps)

{
  int iVar1;
  int16 *piVar2;
  long __off;
  long lVar3;
  size_t n_samples;
  size_t nread;
  int16 data_1 [256];
  long endpos;
  long pos;
  long total;
  int16 *data;
  long maxsamps_local;
  FILE *rawfh_local;
  ps_decoder_t *ps_local;
  
  ps_start_utt(ps);
  if (maxsamps == -1) {
    __off = ftell((FILE *)rawfh);
    if (__off < 0) {
      pos = 0;
      while (iVar1 = feof((FILE *)rawfh), iVar1 == 0) {
        n_samples = fread(&nread,2,0x100,(FILE *)rawfh);
        ps_process_raw(ps,(int16 *)&nread,n_samples,0,0);
        pos = n_samples + pos;
      }
    }
    else {
      fseek((FILE *)rawfh,0,2);
      lVar3 = ftell((FILE *)rawfh);
      fseek((FILE *)rawfh,__off,0);
      piVar2 = (int16 *)__ckd_calloc__(lVar3 - __off,2,
                                       "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/pocketsphinx.c"
                                       ,0x41c);
      pos = fread(piVar2,2,lVar3 - __off,(FILE *)rawfh);
      ps_process_raw(ps,piVar2,pos,0,1);
      ckd_free(piVar2);
    }
  }
  else {
    piVar2 = (int16 *)__ckd_calloc__(maxsamps,2,
                                     "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/pocketsphinx.c"
                                     ,0x412);
    pos = fread(piVar2,2,maxsamps,(FILE *)rawfh);
    ps_process_raw(ps,piVar2,pos,0,1);
    ckd_free(piVar2);
  }
  ps_end_utt(ps);
  return pos;
}

Assistant:

long
ps_decode_raw(ps_decoder_t *ps, FILE *rawfh,
              long maxsamps)
{
    int16 *data;
    long total, pos, endpos;

    ps_start_utt(ps);

    /* If this file is seekable or maxsamps is specified, then decode
     * the whole thing at once. */
    if (maxsamps != -1) {
        data = ckd_calloc(maxsamps, sizeof(*data));
        total = fread(data, sizeof(*data), maxsamps, rawfh);
        ps_process_raw(ps, data, total, FALSE, TRUE);
        ckd_free(data);
    } else if ((pos = ftell(rawfh)) >= 0) {
        fseek(rawfh, 0, SEEK_END);
        endpos = ftell(rawfh);
        fseek(rawfh, pos, SEEK_SET);
        maxsamps = endpos - pos;

        data = ckd_calloc(maxsamps, sizeof(*data));
        total = fread(data, sizeof(*data), maxsamps, rawfh);
        ps_process_raw(ps, data, total, FALSE, TRUE);
        ckd_free(data);
    } else {
        /* Otherwise decode it in a stream. */
        total = 0;
        while (!feof(rawfh)) {
            int16 data[256];
            size_t nread;

            nread = fread(data, sizeof(*data), sizeof(data)/sizeof(*data), rawfh);
            ps_process_raw(ps, data, nread, FALSE, FALSE);
            total += nread;
        }
    }
    ps_end_utt(ps);
    return total;
}